

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::onInvoke
          (RACFGBuilder *this,InvokeNode *invokeNode,RAInstBuilder *ib)

{
  byte bVar1;
  RegGroup RVar2;
  FuncValue a;
  FuncValue a_00;
  undefined4 uVar3;
  undefined1 uVar4;
  bool bVar5;
  Error EVar6;
  uint uVar7;
  RegMask RVar8;
  uint uVar9;
  CallConv *argIndex_00;
  FuncValue *pFVar10;
  RAWorkReg *workReg_00;
  uint32_t *puVar11;
  long in_RSI;
  RegGroup group;
  Iterator __end2;
  Iterator __begin2;
  RegGroupVirtValues *__range2;
  Error _err_4;
  RegGroup retGroup;
  RegGroup regGroup_2;
  Error _err_3;
  RAWorkReg *workReg_1;
  Reg *reg_1;
  Operand *op_1;
  FuncValue *ret;
  uint32_t retIndex;
  Error _err_2;
  RegGroup argGroup;
  RegGroup regGroup_1;
  Error _err_1;
  RegGroup regGroup;
  Error _err;
  RAWorkReg *workReg;
  Reg *reg;
  Operand *op;
  FuncValue *arg;
  uint32_t valueIndex;
  FuncValuePack *argPack;
  uint32_t argIndex;
  FuncDetail *fd;
  uint32_t argCount;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  CallConv *in_stack_fffffffffffffce8;
  BaseRAPass *in_stack_fffffffffffffcf0;
  RegGroup local_2fb;
  RegGroup local_2fa;
  undefined1 local_2f9;
  undefined1 *local_2f8;
  undefined4 local_2ec;
  byte local_2e6;
  byte local_2e5;
  Error local_2e4;
  undefined4 local_2e0;
  uint32_t in_stack_fffffffffffffd24;
  RAWorkReg *in_stack_fffffffffffffd28;
  RAInstBuilder *in_stack_fffffffffffffd30;
  RAWorkReg *this_00;
  uint local_2c0;
  long local_2a8;
  uint local_284;
  uint local_274;
  undefined4 local_1bc;
  Operand *local_1b8;
  FuncValue *local_1b0;
  CallConv *local_1a8;
  undefined1 local_19a;
  undefined1 local_199;
  FuncValue *local_198;
  FuncValue *local_190;
  CallConv *local_188;
  CallConv *local_180;
  ulong local_178;
  long local_170;
  ulong local_168;
  FuncValue *local_158;
  CallConv *local_150;
  CallConv *local_148;
  undefined1 *local_140;
  undefined1 local_131;
  undefined1 *local_130;
  undefined1 local_121;
  RegGroup *local_120;
  RegGroup *local_118;
  RegGroup *local_110;
  byte *local_108;
  RegGroup local_f9;
  long local_f8;
  RegGroup *local_f0;
  undefined1 local_e2;
  undefined1 local_e1;
  Operand *local_e0;
  RAWorkReg *local_d8;
  RAWorkReg *local_d0;
  Operand *local_c8;
  uint *local_c0;
  undefined4 *local_b8;
  undefined4 *local_b0;
  undefined4 *local_a8;
  undefined4 *local_a0;
  uint *local_98;
  undefined4 *local_90;
  Operand *local_88;
  long local_80;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  CallConv *local_68;
  undefined4 local_5c;
  CallConv *local_58;
  undefined4 local_4c;
  FuncValue *local_48;
  undefined1 local_39;
  undefined8 local_38;
  OperandSignature *local_30;
  OperandSignature *local_28;
  undefined1 local_19;
  undefined8 local_18;
  OperandSignature *local_10;
  OperandSignature *local_8;
  
  local_80 = in_RSI + 0x80;
  bVar1 = *(byte *)(in_RSI + 0xf4);
  for (local_274 = 0; local_274 < bVar1; local_274 = local_274 + 1) {
    FuncDetail::argPack((FuncDetail *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                        CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    for (local_284 = 0; local_284 < 4; local_284 = local_284 + 1) {
      in_stack_fffffffffffffcf0 =
           (BaseRAPass *)
           FuncValuePack::operator[]
                     ((FuncValuePack *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0)
                      ,CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      if (*(uint32_t *)&(in_stack_fffffffffffffcf0->super_FuncPass).super_Pass._vptr_Pass != 0) {
        argIndex_00 = (CallConv *)
                      FuncValuePack::operator[]
                                ((FuncValuePack *)
                                 CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                                 CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        in_stack_fffffffffffffce8 = argIndex_00;
        local_1b8 = InvokeNode::arg((InvokeNode *)in_stack_fffffffffffffcf0,(size_t)argIndex_00,
                                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
        local_74 = 0;
        local_70 = 0;
        local_1bc = 0;
        local_90 = &local_1bc;
        local_88 = local_1b8;
        if (((local_1b8->super_Operand_)._signature._bits != 0) &&
           (local_e0 = local_1b8, local_c8 = local_1b8,
           ((local_1b8->super_Operand_)._signature._bits & 7) == 1)) {
          EVar6 = BaseRAPass::virtIndexAsWorkReg
                            (in_stack_fffffffffffffcf0,
                             (uint32_t)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                             (RAWorkReg **)
                             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
          if (EVar6 != 0) {
            return EVar6;
          }
          local_6c = 0x400;
          a._data._0_1_ = argIndex_00->_arch;
          a._data._1_1_ = argIndex_00->_id;
          a._data._2_1_ = argIndex_00->_strategy;
          a._data._3_1_ = argIndex_00->_redZoneSize;
          local_180 = argIndex_00;
          local_68 = argIndex_00;
          bVar5 = Support::test<unsigned_int,unsigned_int>(a._data,0x400);
          if (bVar5) {
            local_c0 = (uint *)(local_2a8 + 0x20);
            local_98 = local_c0;
            if ((*local_c0 & 0xf00) != 0) {
              EVar6 = DebugUtils::errored(3);
              return EVar6;
            }
            local_148 = argIndex_00;
            EVar6 = RAInstBuilder::addCallArg
                              (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                               in_stack_fffffffffffffd24);
joined_r0x001f4d0f:
            if (EVar6 != 0) {
              return EVar6;
            }
          }
          else {
            local_5c = 0x100;
            a_00._data._0_1_ = argIndex_00->_arch;
            a_00._data._1_1_ = argIndex_00->_id;
            a_00._data._2_1_ = argIndex_00->_strategy;
            a_00._data._3_1_ = argIndex_00->_redZoneSize;
            local_1a8 = argIndex_00;
            local_58 = argIndex_00;
            bVar5 = Support::test<unsigned_int,unsigned_int>(a_00._data,0x100);
            if (bVar5) {
              local_b8 = (undefined4 *)(local_2a8 + 0x20);
              uVar3 = *local_b8;
              uVar4 = argIndex_00->_redZoneSize;
              local_e2 = 1;
              local_38 = 0x1fe0d8;
              local_199 = uVar4;
              local_188 = argIndex_00;
              local_a0 = local_b8;
              local_39 = uVar4;
              local_30 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                         operator[]<asmjit::v1_14::RegType>
                                   ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                                    (RegType *)
                                    CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
              local_28 = local_30;
              if (((byte)((uint)uVar3 >> 8) & 0xf) == ((byte)(local_30->_bits >> 8) & 0xf)) {
                local_150 = argIndex_00;
                EVar6 = RAInstBuilder::addCallArg
                                  (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                                   in_stack_fffffffffffffd24);
                goto joined_r0x001f4d0f;
              }
            }
          }
        }
      }
    }
  }
  for (local_2c0 = 0; local_2c0 < 4; local_2c0 = local_2c0 + 1) {
    local_178 = (ulong)local_2c0;
    local_170 = in_RSI + 0x80;
    pFVar10 = FuncValuePack::operator[]
                        ((FuncValuePack *)
                         CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                         CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    if (pFVar10->_data == 0) break;
    local_168 = (ulong)local_2c0;
    workReg_00 = (RAWorkReg *)
                 InvokeNode::OperandPack::operator[]
                           ((OperandPack *)in_stack_fffffffffffffce8,
                            CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    local_190 = pFVar10;
    if (((char)(pFVar10->_data >> 0x18) != '\x16') &&
       (local_d8 = workReg_00, local_d0 = workReg_00, (*(uint *)workReg_00 & 7) == 1)) {
      this_00 = workReg_00;
      local_2e4 = BaseRAPass::virtIndexAsWorkReg
                            (in_stack_fffffffffffffcf0,
                             (uint32_t)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                             (RAWorkReg **)
                             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      if (local_2e4 != 0) {
        return local_2e4;
      }
      local_4c = 0x100;
      local_1b0 = pFVar10;
      local_48 = pFVar10;
      bVar5 = Support::test<unsigned_int,unsigned_int>(pFVar10->_data,0x100);
      if (!bVar5) {
        EVar6 = DebugUtils::errored(0x19);
        return EVar6;
      }
      local_b0 = (undefined4 *)(CONCAT44(in_stack_fffffffffffffd24,local_2e0) + 0x20);
      local_2e5 = (byte)((uint)*local_b0 >> 8) & 0xf;
      local_19a = (undefined1)(pFVar10->_data >> 0x18);
      local_e1 = 1;
      local_18 = 0x1fe0d8;
      local_198 = pFVar10;
      local_a8 = local_b0;
      local_19 = local_19a;
      local_10 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                 operator[]<asmjit::v1_14::RegType>
                           ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                            CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                            (RegType *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)
                           );
      local_2e6 = (byte)(local_10->_bits >> 8) & 0xf;
      local_8 = local_10;
      if (local_2e5 == local_2e6) {
        local_158 = pFVar10;
        EVar6 = RAInstBuilder::addCallRet
                          ((RAInstBuilder *)this_00,workReg_00,in_stack_fffffffffffffd24);
        if (EVar6 != 0) {
          return EVar6;
        }
        local_2ec = 0;
      }
    }
  }
  local_2f8 = &local_2f9;
  local_131 = 0;
  local_2fa = k0;
  local_121 = 4;
  local_2fb = kPC;
  local_140 = local_2f8;
  local_130 = local_2f8;
  while( true ) {
    local_118 = &local_2fa;
    local_120 = &local_2fb;
    if (local_2fa == local_2fb) break;
    local_110 = &local_2fa;
    RVar2 = local_2fa;
    in_stack_fffffffffffffce4 = CONCAT13(local_2fa,(int3)in_stack_fffffffffffffce4);
    local_108 = RARegCount::operator[]((RARegCount *)in_stack_fffffffffffffce8,local_2fa);
    uVar7 = (int)(1L << (*local_108 & 0x3f)) - 1;
    local_f9 = RVar2;
    local_f8 = in_RSI + 0x80;
    RVar8 = CallConv::preservedRegs
                      (in_stack_fffffffffffffce8,(RegGroup)((uint)in_stack_fffffffffffffce4 >> 0x18)
                      );
    uVar9 = uVar7 & (RVar8 ^ 0xffffffff);
    puVar11 = RARegMask::operator[]<asmjit::v1_14::RegGroup>
                        ((RARegMask *)CONCAT44(in_stack_fffffffffffffce4,uVar9),
                         (RegGroup *)CONCAT44(uVar7,in_stack_fffffffffffffcd8));
    *puVar11 = uVar9;
    local_f0 = &local_2fa;
    local_2fa = local_2fa + kVec;
  }
  return 0;
}

Assistant:

Error RACFGBuilder::onInvoke(InvokeNode* invokeNode, RAInstBuilder& ib) noexcept {
  uint32_t argCount = invokeNode->argCount();
  const FuncDetail& fd = invokeNode->detail();

  for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
    const FuncValuePack& argPack = fd.argPack(argIndex);
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      if (!argPack[valueIndex])
        continue;

      const FuncValue& arg = argPack[valueIndex];
      const Operand& op = invokeNode->arg(argIndex, valueIndex);

      if (op.isNone())
        continue;

      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (arg.isIndirect()) {
          RegGroup regGroup = workReg->group();
          if (regGroup != RegGroup::kGp)
            return DebugUtils::errored(kErrorInvalidState);
          ASMJIT_PROPAGATE(ib.addCallArg(workReg, arg.regId()));
        }
        else if (arg.isReg()) {
          RegGroup regGroup = workReg->group();
          RegGroup argGroup = Reg::groupOf(arg.regType());

          if (regGroup == argGroup) {
            ASMJIT_PROPAGATE(ib.addCallArg(workReg, arg.regId()));
          }
        }
      }
    }
  }

  for (uint32_t retIndex = 0; retIndex < Globals::kMaxValuePack; retIndex++) {
    const FuncValue& ret = fd.ret(retIndex);
    if (!ret)
      break;

    // Not handled here...
    const Operand& op = invokeNode->ret(retIndex);
    if (ret.regType() == RegType::kX86_St)
      continue;

    if (op.isReg()) {
      const Reg& reg = op.as<Reg>();
      RAWorkReg* workReg;
      ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

      if (ret.isReg()) {
        RegGroup regGroup = workReg->group();
        RegGroup retGroup = Reg::groupOf(ret.regType());

        if (regGroup == retGroup) {
          ASMJIT_PROPAGATE(ib.addCallRet(workReg, ret.regId()));
        }
      }
      else {
        return DebugUtils::errored(kErrorInvalidAssignment);
      }
    }
  }

  // Setup clobbered registers.
  for (RegGroup group : RegGroupVirtValues{})
    ib._clobbered[group] = Support::lsbMask<RegMask>(_pass->_physRegCount[group]) & ~fd.preservedRegs(group);

  return kErrorOk;
}